

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void flatview_insert(FlatView *view,uint pos,FlatRange *range)

{
  hwaddr hVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Int128 IVar5;
  Int128 IVar6;
  _Bool _Var7;
  undefined7 uVar8;
  FlatRange *pFVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar10 = view->nr;
  if (uVar10 == view->nr_allocated) {
    uVar11 = 10;
    if (10 < uVar10 * 2) {
      uVar11 = (ulong)(uVar10 * 2);
    }
    view->nr_allocated = (uint)uVar11;
    pFVar9 = (FlatRange *)g_realloc(view->ranges,uVar11 << 6);
    view->ranges = pFVar9;
    uVar10 = view->nr;
  }
  else {
    pFVar9 = view->ranges;
  }
  memmove(pFVar9 + (ulong)pos + 1,pFVar9 + pos,(ulong)(uVar10 - pos) << 6);
  pFVar9 = view->ranges;
  hVar1 = range->offset_in_region;
  IVar5 = (range->addr).start;
  uVar2 = *(undefined8 *)((long)&(range->addr).start + 8);
  IVar6 = (range->addr).size;
  uVar3 = *(undefined8 *)((long)&(range->addr).size + 8);
  _Var7 = range->readonly;
  uVar8 = *(undefined7 *)&range->field_0x31;
  uVar4 = *(undefined8 *)&range->field_0x38;
  pFVar9[pos].mr = range->mr;
  pFVar9[pos].offset_in_region = hVar1;
  *(long *)&pFVar9[pos].addr.start = (long)IVar5;
  *(undefined8 *)((long)&pFVar9[pos].addr.start + 8) = uVar2;
  *(long *)&pFVar9[pos].addr.size = (long)IVar6;
  *(undefined8 *)((long)&pFVar9[pos].addr.size + 8) = uVar3;
  pFVar9 = pFVar9 + pos;
  pFVar9->readonly = _Var7;
  *(undefined7 *)&pFVar9->field_0x31 = uVar8;
  *(undefined8 *)(&pFVar9->readonly + 8) = uVar4;
  view->nr = view->nr + 1;
  return;
}

Assistant:

static void flatview_insert(FlatView *view, unsigned pos, FlatRange *range)
{
    if (view->nr == view->nr_allocated) {
        view->nr_allocated = MAX(2 * view->nr, 10);
        view->ranges = g_realloc(view->ranges,
                                    view->nr_allocated * sizeof(*view->ranges));
    }
    memmove(view->ranges + pos + 1, view->ranges + pos,
            (view->nr - pos) * sizeof(FlatRange));
    view->ranges[pos] = *range;
    ++view->nr;
}